

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O2

void __thiscall
lexical::analyse(lexical *this,
                vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
                *lines)

{
  char cVar1;
  int iVar2;
  element_type *peVar3;
  pointer pcVar4;
  size_type sVar5;
  iterator ch;
  bool bVar6;
  int iVar7;
  allocator local_89;
  iterator it;
  Meta local_80;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  local_58 = (lines->
             super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (lines->
             super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (local_58 == local_60) {
      return;
    }
    peVar3 = (local_58->super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pcVar4 = (peVar3->text)._M_dataplus._M_p;
    sVar5 = (peVar3->text)._M_string_length;
    iVar2 = peVar3->line;
    it._M_current = pcVar4;
    while (ch._M_current = it._M_current, it._M_current != pcVar4 + sVar5) {
      local_80.column = ((int)it._M_current - (int)pcVar4) + 1;
      local_80.line = iVar2;
      local_80.cur_begin._M_current = it._M_current;
      local_80.begin._M_current = pcVar4;
      local_80.end._M_current = pcVar4 + sVar5;
      bVar6 = sutil::is_blank(it._M_current);
      if (bVar6) {
        it._M_current = ch._M_current + 1;
      }
      else {
        bVar6 = sutil::is_key(ch._M_current,true);
        if (bVar6) {
          analyse_identifier(this,&it,&local_80);
        }
        else {
          cVar1 = *ch._M_current;
          if ((int)cVar1 - 0x30U < 10) {
LAB_0010bfbb:
            analyse_number(this,&it,&local_80);
          }
          else if (cVar1 == '.') {
            if ((int)ch._M_current[1] - 0x30U < 10) goto LAB_0010bfbb;
LAB_0010c015:
            bVar6 = Table::in_delimiter(&this->table,ch._M_current);
            if (bVar6) {
              analyse_delimiter(this,&it,&local_80);
            }
            else {
              bVar6 = Table::in_operator(&this->table,ch._M_current);
              if (bVar6) {
                analyse_operator(this,&it,&local_80);
              }
              else if (*ch._M_current == '\"') {
                analyse_string(this,&it,&local_80);
              }
              else if (*ch._M_current == '\'') {
                analyse_char(this,&it,&local_80);
              }
              else {
                std::__cxx11::string::string((string *)&local_50,anon_var_dwarf_2bb11,&local_89);
                error(this,&it,&local_80,&local_50);
                std::__cxx11::string::~string((string *)&local_50);
              }
            }
          }
          else {
            if (cVar1 != '@') {
              if ((cVar1 != '0') || (iVar7 = tolower((int)cVar1), iVar7 != 0x78)) goto LAB_0010c015;
              goto LAB_0010bfbb;
            }
            analyse_annotation(this,&it,&local_80);
          }
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void lexical::analyse(vector<shared_ptr<StringLine>> lines) {
    Meta meta;
    for (const auto &line : lines) {
        auto begin = line->get_text().begin();
        auto end = line->get_text().end();
        auto it = begin;
        int lineNumber = line->get_line();
        while (it != end) {
            int column = it - begin + 1;
            meta = Meta(lineNumber, column, it, begin, end);
            //空白字符不判断
            if (sutil::is_blank(*it)) {
                ++it;
                continue;
            }
            if (sutil::is_key(*it, true)) {
                if (analyse_identifier(it, meta)) continue;
            } else if (isdigit(*it) || (*it == '0' && tolower(*it) == 'x') || (*it == '.' && isdigit(*(it + 1)))) {
                if (analyse_number(it, meta))continue;
            } else if (*it == '@') {
                if (analyse_annotation(it, meta))continue;
            } else if (table.in_delimiter(*it)) {
                if (analyse_delimiter(it, meta))continue;
            } else if (table.in_operator(*it)) {
                if (analyse_operator(it, meta))continue;
            } else if (*it == '\'') {
                if (analyse_char(it, meta))continue;
            } else if (*it == '\"') {
                if (analyse_string(it, meta))continue;
            } else {
                error(it, meta, "非法的字符");
            }
        }
    }
}